

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_51181::P::P(P *this)

{
  shared_ptr<ccs::CcsLogger> local_20;
  
  ::ccs::CcsLogger::makeStdErrLogger();
  ::ccs::CcsTracer::makeLoggingTracer((CcsTracer *)this,&local_20,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<ccs::CcsLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::ccs::Parser::Parser
            (&this->parser,
             (this->trace).super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  return;
}

Assistant:

P() :
    trace(CcsTracer::makeLoggingTracer(CcsLogger::makeStdErrLogger())),
    parser(*trace) {}